

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FibHeap.h
# Opt level: O0

void __thiscall
FibHeap<std::pair<double,_int>_>::decKey
          (FibHeap<std::pair<double,_int>_> *this,Node *x,pair<double,_int> *key)

{
  bool bVar1;
  Node *in_RDX;
  Node *in_RSI;
  Node *in_RDI;
  Node *y;
  Node *this_00;
  
  std::pair<double,_int>::operator=(&in_RSI->key,&in_RDX->key);
  this_00 = in_RSI->p;
  if ((this_00 != (Node *)0x0) && (bVar1 = std::operator<(&in_RSI->key,&this_00->key), bVar1)) {
    cut((FibHeap<std::pair<double,_int>_> *)this_00,in_RDI);
    cascadingCut((FibHeap<std::pair<double,_int>_> *)in_RSI,in_RDX);
  }
  bVar1 = std::operator<(&in_RSI->key,&in_RDI->head->key);
  if (bVar1) {
    in_RDI->head = in_RSI;
  }
  return;
}

Assistant:

void decKey(Node *x, const K &key)
	{
		x->key = key;
		Node *y = x->p;
		if (y && x->key < y->key)
			cut(x), cascadingCut(y);
		if (x->key < min->key)
			min = x;
	}